

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O2

SRC_ERROR sinc_mono_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  int iVar2;
  SINC_FILTER *filter;
  long lVar3;
  double dVar4;
  SRC_ERROR SVar5;
  int iVar6;
  uint uVar7;
  int half_filter_chan_len;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int divisor;
  int iVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar5 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar14 = state->channels;
    uVar10 = (ulong)iVar14;
    filter->in_count = data->input_frames * uVar10;
    lVar13 = data->output_frames * uVar10;
    filter->out_count = lVar13;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar16 = state->last_ratio;
    SVar5 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar16) && (dVar16 <= 256.0)) {
      dVar20 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar4 = dVar16;
      if (data->src_ratio <= dVar16) {
        dVar4 = data->src_ratio;
      }
      dVar19 = state->last_position;
      dVar18 = dVar19 - (double)(int)ROUND(dVar19);
      dVar18 = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar18 |
                       (ulong)(dVar18 + 1.0) & -(ulong)(dVar18 < 0.0));
      half_filter_chan_len =
           ((int)ROUND((double)(-(ulong)(dVar4 < 1.0) & (ulong)(dVar20 / dVar4) |
                               ~-(ulong)(dVar4 < 1.0) & (ulong)dVar20)) + 1) * iVar14;
      iVar6 = filter->b_len;
      lVar3 = (long)((int)ROUND(dVar19 - dVar18) * iVar14 + filter->b_current) % (long)iVar6;
      filter->b_current = (int)lVar3;
      dVar4 = 1.0 / dVar16;
      lVar11 = 0;
      while (iVar14 = (int)lVar3, lVar11 < lVar13) {
        if (((filter->b_end - iVar14) + iVar6) % iVar6 <= half_filter_chan_len) {
          SVar5 = prepare_data(filter,(int)uVar10,data,half_filter_chan_len);
          state->error = SVar5;
          if (SVar5 != SRC_ERR_NO_ERROR) {
            return SVar5;
          }
          iVar14 = filter->b_current;
          if (((filter->b_end - iVar14) + filter->b_len) % filter->b_len <= half_filter_chan_len)
          break;
        }
        if ((-1 < filter->b_real_end) &&
           ((double)filter->b_real_end < (double)iVar14 + dVar18 + dVar4 + 1e-20)) break;
        if (0 < filter->out_count) {
          dVar20 = state->last_ratio;
          if (1e-10 < ABS(dVar20 - data->src_ratio)) {
            dVar16 = ((data->src_ratio - dVar20) * (double)filter->out_gen) /
                     (double)filter->out_count + dVar20;
          }
        }
        iVar2 = filter->index_inc;
        dVar20 = dVar16;
        if (1.0 <= dVar16) {
          dVar20 = 1.0;
        }
        dVar20 = dVar20 * (double)iVar2;
        divisor = (int)ROUND(dVar20 * 4096.0);
        iVar12 = (int)ROUND(dVar18 * dVar20 * 4096.0);
        iVar9 = filter->coeff_half_len * 0x1000;
        iVar6 = (iVar9 - iVar12) / divisor;
        uVar8 = iVar6 * divisor + iVar12;
        uVar15 = iVar14 - iVar6;
        if ((int)uVar15 < 0) {
          uVar7 = int_div_ceil(uVar8,divisor);
          if (uVar7 < -uVar15) {
            __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x184,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          uVar8 = uVar8 + uVar15 * divisor;
          uVar15 = 0;
        }
        uVar10 = (ulong)uVar15;
        dVar19 = 0.0;
        for (; -1 < (int)uVar8; uVar8 = uVar8 - divisor) {
          uVar15 = uVar8 >> 0xc;
          if (filter->coeff_half_len < (int)uVar15) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x18c,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          if ((long)filter->b_len <= (long)uVar10) {
            __assert_fail("data_index >= 0 && data_index < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x18e,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          if ((long)filter->b_end <= (long)uVar10) {
            __assert_fail("data_index < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,399,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)")
            ;
          }
          fVar1 = filter->coeffs[uVar15];
          dVar19 = dVar19 + (double)filter->buffer[uVar10] *
                            ((double)(uVar8 & 0xfff) * 0.000244140625 *
                             (double)(filter->coeffs[(ulong)uVar15 + 1] - fVar1) + (double)fVar1);
          uVar10 = uVar10 + 1;
        }
        iVar6 = (iVar9 - (divisor - iVar12)) / divisor;
        iVar14 = filter->b_current;
        uVar15 = iVar6 + iVar14 + 1;
        uVar8 = iVar6 * divisor + (divisor - iVar12);
        dVar17 = 0.0;
        do {
          iVar9 = (int)uVar8 >> 0xc;
          if (filter->coeff_half_len + 2 <= iVar9) {
            __assert_fail("indx < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x1a0,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          if (((int)uVar15 < 0) || (iVar6 = filter->b_len, iVar6 <= (int)uVar15)) {
            __assert_fail("data_index >= 0 && data_index < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x1a2,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          if (filter->b_end <= (int)uVar15) {
            __assert_fail("data_index < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x1a3,
                          "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
          }
          fVar1 = filter->coeffs[iVar9];
          dVar17 = dVar17 + (double)filter->buffer[uVar15] *
                            ((double)(uVar8 & 0xfff) * 0.000244140625 *
                             (double)(filter->coeffs[(long)iVar9 + 1] - fVar1) + (double)fVar1);
          uVar8 = uVar8 - divisor;
          uVar15 = uVar15 - 1;
        } while (0 < (int)uVar8);
        lVar11 = filter->out_gen;
        data->data_out[lVar11] = (float)((dVar20 / (double)iVar2) * (dVar19 + dVar17));
        lVar11 = lVar11 + 1;
        filter->out_gen = lVar11;
        dVar19 = dVar18 + 1.0 / dVar16;
        dVar20 = dVar19 - (double)(int)ROUND(dVar19);
        dVar18 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                         (ulong)(dVar20 + 1.0) & -(ulong)(dVar20 < 0.0));
        uVar10 = (ulong)(uint)state->channels;
        lVar3 = (long)((int)ROUND(dVar19 - dVar18) * state->channels + iVar14) % (long)iVar6;
        filter->b_current = (int)lVar3;
        lVar13 = filter->out_count;
      }
      state->last_position = dVar18;
      state->last_ratio = dVar16;
      iVar14 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar14;
      data->output_frames_gen = filter->out_gen / (long)iVar14;
      SVar5 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar5;
}

Assistant:

static SRC_ERROR
sinc_mono_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate > filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		data->data_out [filter->out_gen] = (float) ((float_increment / filter->index_inc) *
										calc_output_single (filter, increment, start_filter_index)) ;
		filter->out_gen ++ ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}